

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O0

void __thiscall OpenMD::Torsion::~Torsion(Torsion *this)

{
  Torsion *in_RDI;
  
  ~Torsion(in_RDI);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

virtual ~Torsion() {}